

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_encode.cpp
# Opt level: O3

string_t __thiscall
duckdb::URLDecodeOperator::Operation<duckdb::string_t,duckdb::string_t>
          (URLDecodeOperator *this,string_t input,Vector *result)

{
  Vector *vector;
  ulong uVar1;
  idx_t len;
  char *output;
  char *input_00;
  string_t sVar2;
  string_t result_str;
  undefined1 local_38 [16];
  undefined8 local_28;
  char *local_20;
  
  local_20 = input.value._0_8_;
  input_00 = (char *)((long)&local_28 + 4);
  if (0xc < (uint)this) {
    input_00 = local_20;
  }
  local_28 = this;
  vector = (Vector *)StringUtil::URLDecodeSize(input_00,(ulong)this & 0xffffffff,false);
  local_38 = (undefined1  [16])StringVector::EmptyString(input.value._8_8_,vector,len);
  output = local_38._8_8_;
  if (local_38._0_4_ < 0xd) {
    output = local_38 + 4;
  }
  StringUtil::URLDecodeBuffer(input_00,(ulong)this & 0xffffffff,output,false);
  uVar1 = (ulong)(uint)local_38._0_4_;
  if (uVar1 < 0xd) {
    switchD_012e3010::default(local_38 + 4 + uVar1,0,0xc - uVar1);
  }
  else {
    local_38._4_4_ = *(undefined4 *)local_38._8_8_;
  }
  sVar2.value.pointer.ptr = (char *)local_38._8_8_;
  sVar2.value._0_8_ = local_38._0_8_;
  return (string_t)sVar2.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_str = input.GetData();
		auto input_size = input.GetSize();
		idx_t result_length = StringUtil::URLDecodeSize(input_str, input_size);
		auto result_str = StringVector::EmptyString(result, result_length);
		StringUtil::URLDecodeBuffer(input_str, input_size, result_str.GetDataWriteable());
		result_str.Finalize();
		return result_str;
	}